

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::NewCovergroupExpression>
          (StaticInitializerVisitor *this,NewCovergroupExpression *expr)

{
  ExpressionKind EVar1;
  SymbolKind SVar2;
  size_t sVar3;
  pointer ppEVar4;
  SystemSubroutine *pSVar5;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar6;
  pointer ppFVar7;
  optional<bool> oVar8;
  int iVar9;
  Symbol *this_00;
  Expression *pEVar10;
  Diagnostic *this_01;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar11;
  Diagnostic *this_02;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  long lVar13;
  size_t sVar14;
  VariableSymbol *var;
  bool bVar15;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 - NamedValue < 2) {
    this_00 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (this_00 != (Symbol *)0x0) {
      SVar2 = this_00->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_01 = ASTContext::addDiag(this->context,(DiagCode)0xf80006,
                                      (expr->super_Expression).sourceRange);
LAB_00251e2b:
        this_02 = Diagnostic::operator<<(this_01,this->sourceVar->name);
        Diagnostic::operator<<(this_02,this_00->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,this_00->location);
        return;
      }
      if ((SVar2 == Variable) && (this_00 != this->sourceVar)) {
        pEVar10 = DeclaredType::getInitializer((DeclaredType *)(this_00 + 1));
        bVar15 = this_00[5].name._M_len != 0;
        oVar8 = Symbol::isDeclaredBefore(this_00,this->sourceVar);
        if ((bVar15 || pEVar10 == (Expression *)0x0) ||
           ((((ushort)oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar8.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          this_01 = ASTContext::addDiag(this->context,
                                        (DiagCode)
                                        ((uint)(bVar15 || pEVar10 == (Expression *)0x0) * 0x10000 +
                                        0xf70006),(expr->super_Expression).sourceRange);
          goto LAB_00251e2b;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc == '\x01') {
      pvVar11 = std::
                get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)&expr->arguments);
      sVar3 = expr[1].arguments._M_extent._M_extent_value;
      if (sVar3 != 0) {
        pSVar5 = (pvVar11->subroutine).ptr;
        ppEVar4 = expr[1].arguments._M_ptr;
        sVar14 = 0;
        do {
          iVar9 = (*pSVar5->_vptr_SystemSubroutine[4])(pSVar5,sVar14);
          if ((char)iVar9 == '\0') {
            pEVar10 = ppEVar4[sVar14];
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar10,pEVar10,this);
          }
          sVar14 = sVar14 + 1;
        } while (sVar3 != sVar14);
      }
    }
    else {
      ppSVar12 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->arguments);
      pSVar6 = *ppSVar12;
      if ((pSVar6->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar6->super_Scope);
      }
      sVar3 = expr[1].arguments._M_extent._M_extent_value;
      if (sVar3 != 0) {
        ppFVar7 = (pSVar6->arguments)._M_ptr;
        ppEVar4 = expr[1].arguments._M_ptr;
        sVar14 = 0;
        do {
          if (ppFVar7[sVar14]->direction == In) {
            pEVar10 = ppEVar4[sVar14];
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar10,pEVar10,this);
          }
          sVar14 = sVar14 + 1;
        } while (sVar3 != sVar14);
      }
    }
  }
  else if ((EVar1 != NewCovergroup) &&
          (sVar3 = (expr->arguments)._M_extent._M_extent_value, sVar3 != 0)) {
    ppEVar4 = (expr->arguments)._M_ptr;
    lVar13 = 0;
    do {
      pEVar10 = *(Expression **)((long)ppEVar4 + lVar13);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                (pEVar10,pEVar10,this);
      lVar13 = lVar13 + 8;
    } while (sVar3 << 3 != lVar13);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }